

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ActionBlockSyntax::getChild(ActionBlockSyntax *this,size_t index)

{
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  
  if (in_RDX == 0) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax ActionBlockSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return statement;
        case 1: return elseClause;
        default: return nullptr;
    }
}